

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O0

_Bool borg_check_rest(wchar_t y,wchar_t x)

{
  ushort uVar1;
  wchar_t y_00;
  bool bVar2;
  chunk_conflict *c;
  monster_race *pmVar3;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t wVar6;
  loc_conflict grid;
  borg_kill *pbVar7;
  int local_84;
  int local_80;
  int local_7c;
  wchar_t p;
  wchar_t d;
  wchar_t ay;
  wchar_t ax;
  wchar_t y9;
  wchar_t x9;
  monster_race *r_ptr;
  borg_kill *kill;
  int local_1c;
  wchar_t wStack_18;
  _Bool borg_in_vault;
  wchar_t ii;
  wchar_t i;
  wchar_t x_local;
  wchar_t y_local;
  
  bVar2 = false;
  if ((borg.trait[0x1b] == borg.trait[0x1c]) &&
     (_Var4 = flag_has_dbg((player->state).pflags,3,0x11,"player->state.pflags","(PF_COMBAT_REGEN)")
     , _Var4)) {
    x_local._3_1_ = false;
  }
  else if ((borg_t + -4 < (int)borg.when_last_kill_mult) && (borg.when_last_kill_mult <= borg_t)) {
    x_local._3_1_ = false;
  }
  else if (((((((borg.temp.bless & 1U) == 0) && ((borg.temp.hero & 1U) == 0)) &&
             ((borg.temp.berserk & 1U) == 0)) &&
            (((borg.temp.fastcast & 1U) == 0 && ((borg.temp.regen & 1U) == 0)))) &&
           ((borg.temp.smite_evil & 1U) == 0)) ||
          ((((borg.munchkin_mode & 1U) != 0 || (borg.trait[0x1b] < (borg.trait[0x1c] << 3) / 10)) ||
           (borg.trait[0x1e] < (borg.trait[0x1f] * 7) / 10)))) {
    borg.when_last_kill_mult = 0;
    if ((vault_on_level & 1U) != 0) {
      for (wStack_18 = -1; wStack_18 < 1; wStack_18 = wStack_18 + 1) {
        for (local_1c = -1; c = cave, local_1c < 1; local_1c = local_1c + 1) {
          grid = (loc_conflict)loc(borg.c.x + local_1c,borg.c.y + wStack_18);
          _Var4 = square_in_bounds_fully((chunk *)c,grid);
          if ((_Var4) && (borg_grids[borg.c.y + wStack_18][borg.c.x + local_1c].feat == '\x16')) {
            bVar2 = true;
          }
        }
      }
    }
    if ((((borg.no_rest_prep < 1) || ((borg.munchkin_mode & 1U) != 0)) ||
        (borg.trait[0x1e] <= borg.trait[0x1f] / 4)) || (0x54 < borg.trait[0x69])) {
      if ((borg_grids[y][x].feat == '\x17') && (borg.trait[0x40] == 0)) {
        x_local._3_1_ = false;
      }
      else {
        if (!bVar2) {
          if ((borg.trait[0x1b] / 0x14 < (int)(uint)borg_fear_region[y / 0xb][x / 0xb]) &&
             (borg.trait[0x69] != 100)) {
            return false;
          }
          if ((borg.trait[0x1b] / 10 < (int)(uint)borg_fear_monsters[y][x]) &&
             (borg.trait[0x69] != 100)) {
            return false;
          }
          wVar5 = borg_danger(y,x,L'\x01',true,false);
          if ((borg.trait[0x1b] / 0x28 < wVar5) && (0x54 < borg.trait[0x69])) {
            return false;
          }
          if ((((borg.trait[0x1a] == 0) || (borg.trait[0x6c] != 0)) || (borg.trait[0x27] < 2)) &&
             ((borg.munchkin_mode & 1U) == 0)) {
            return false;
          }
        }
        for (wStack_18 = L'\x01'; pmVar3 = r_info, wStack_18 < borg_kills_nxt;
            wStack_18 = wStack_18 + L'\x01') {
          pbVar7 = borg_kills + wStack_18;
          uVar1 = pbVar7->r_idx;
          wVar5 = (pbVar7->pos).x;
          y_00 = (pbVar7->pos).y;
          if (pbVar7->r_idx != 0) {
            if (x < wVar5) {
              local_7c = wVar5 - x;
            }
            else {
              local_7c = x - wVar5;
            }
            if (y < y_00) {
              local_80 = y_00 - y;
            }
            else {
              local_80 = y - y_00;
            }
            if (local_7c < local_80) {
              local_84 = local_80;
            }
            else {
              local_84 = local_7c;
            }
            if (local_84 <= (int)(uint)z_info->max_range) {
              if ((local_84 < 2) &&
                 (_Var4 = flag_has_dbg(r_info[uVar1].flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE"),
                 !_Var4)) {
                return false;
              }
              if (local_84 == 1) {
                return false;
              }
              if ((local_84 < 10) &&
                 (_Var4 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY"),
                 _Var4)) {
                return false;
              }
              if ((((pbVar7->awake & 1U) != 0) || (local_84 < 9)) ||
                 ((borg.munchkin_mode & 1U) != 0)) {
                wVar6 = borg_danger_one_kill(y_00,wVar5,L'\x01',wStack_18,true,true);
                if (((!bVar2) && (local_84 < 5)) &&
                   (((int)avoidance / 3 < wVar6 && ((borg.munchkin_mode & 1U) == 0)))) {
                  return false;
                }
                _Var4 = borg_los(y_00,wVar5,y,x);
                if ((_Var4) && (pbVar7->ranged_attack != '\0')) {
                  return false;
                }
                if (((((borg.munchkin_mode & 1U) != 0) && (_Var4 = borg_los(y_00,wVar5,y,x), _Var4))
                    && ((pbVar7->awake & 1U) != 0)) &&
                   (_Var4 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE"
                                        ), !_Var4)) {
                  return false;
                }
                _Var4 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
                if ((_Var4) && (!bVar2)) {
                  return false;
                }
                _Var4 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL");
                if ((_Var4) && (!bVar2)) {
                  return false;
                }
              }
            }
          }
        }
        x_local._3_1_ = true;
      }
    }
    else {
      x_local._3_1_ = false;
    }
  }
  else {
    x_local._3_1_ = false;
  }
  return x_local._3_1_;
}

Assistant:

bool borg_check_rest(int y, int x)
{
    int  i, ii;
    bool borg_in_vault = false;

    /* never rest to recover SP (if HP at max) if you only recover */
    /* sp in combat */
    if (borg.trait[BI_CURHP] == borg.trait[BI_MAXHP]
        && player_has(player, PF_COMBAT_REGEN))
        return false;

    /* Do not rest recently after killing a multiplier */
    /* This will avoid the problem of resting next to */
    /* an unkown area full of breeders */
    if (borg.when_last_kill_mult > (borg_t - 4)
        && borg.when_last_kill_mult <= borg_t)
        return false;

    /* No resting if Blessed and good HP and good SP */
    /* don't rest for SP if you do combat regen */
    if ((borg.temp.bless || borg.temp.hero || borg.temp.berserk
            || borg.temp.fastcast || borg.temp.regen || borg.temp.smite_evil)
        && !borg.munchkin_mode
        && (borg.trait[BI_CURHP] >= borg.trait[BI_MAXHP] * 8 / 10)
        && (borg.trait[BI_CURSP] >= borg.trait[BI_MAXSP] * 7 / 10))
        return false;

    /* Set this to Zero */
    borg.when_last_kill_mult = 0;

    /* Most of the time, its ok to rest in a vault */
    if (vault_on_level) {
        for (i = -1; i < 1; i++) {
            for (ii = -1; ii < 1; ii++) {
                /* check bounds */
                if (!square_in_bounds_fully(
                        cave, loc(borg.c.x + ii, borg.c.y + i)))
                    continue;

                if (borg_grids[borg.c.y + i][borg.c.x + ii].feat == FEAT_PERM)
                    borg_in_vault = true;
            }
        }
    }

    /* No resting to recover if I just cast a prepatory spell
     * which is what I like to do right before I take a stair,
     * Unless I am down by three quarters of my SP.
     */
    if (borg.no_rest_prep >= 1 && !borg.munchkin_mode
        && borg.trait[BI_CURSP] > borg.trait[BI_MAXSP] / 4
        && borg.trait[BI_CDEPTH] < 85)
        return false;

    /* Don't rest on lava unless we are immune to fire */
    if (borg_grids[y][x].feat == FEAT_LAVA && !borg.trait[BI_IFIRE])
        return false;

    /* Dont worry about fears if in a vault */
    if (!borg_in_vault) {
        /* Be concerned about the Regional Fear. */
        if (borg_fear_region[y / 11][x / 11] > borg.trait[BI_CURHP] / 20
            && borg.trait[BI_CDEPTH] != 100)
            return false;

        /* Be concerned about the Monster Fear. */
        if (borg_fear_monsters[y][x] > borg.trait[BI_CURHP] / 10
            && borg.trait[BI_CDEPTH] != 100)
            return false;

        /* Be concerned about the Monster Danger. */
        if (borg_danger(y, x, 1, true, false) > borg.trait[BI_CURHP] / 40
            && borg.trait[BI_CDEPTH] >= 85)
            return false;

        /* Be concerned if low on food */
        if ((borg.trait[BI_LIGHT] == 0 || borg.trait[BI_ISWEAK]
                || borg.trait[BI_FOOD] < 2)
            && !borg.munchkin_mode)
            return false;
    }

    /* Examine all the monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill           *kill  = &borg_kills[i];
        struct monster_race *r_ptr = &r_info[kill->r_idx];

        int x9                     = kill->pos.x;
        int y9                     = kill->pos.y;
        int ax, ay, d;
        int p = 0;

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Distance components */
        ax = (x9 > x) ? (x9 - x) : (x - x9);
        ay = (y9 > y) ? (y9 - y) : (y - y9);

        /* Distance */
        d = MAX(ax, ay);

        /* Minimal distance */
        if (d > z_info->max_range)
            continue;

        /* if too close to a Mold or other Never-Mover, don't rest */
        if (d < 2 && !(rf_has(r_ptr->flags, RF_NEVER_MOVE)))
            return false;
        if (d == 1)
            return false;

        /* if too close to a Multiplier, don't rest */
        if (d < 10 && (rf_has(r_ptr->flags, RF_MULTIPLY)))
            return false;

        /* If monster is asleep, dont worry */
        if (!kill->awake && d > 8 && !borg.munchkin_mode)
            continue;

        /* one call for dangers */
        p = borg_danger_one_kill(y9, x9, 1, i, true, true);

        /* Ignore proximity checks while inside a vault */
        if (!borg_in_vault) {
            /* Real scary guys pretty close */
            if (d < 5 && (p > avoidance / 3) && !borg.munchkin_mode)
                return false;

            /* scary guys far away */
            /*if (d < 17 && d > 5 && (p > avoidance/3)) return false; */
        }

        /* should check LOS... monster to me concerned for Ranged Attacks */
        if (borg_los(y9, x9, y, x) && kill->ranged_attack)
            return false;

        /* Special handling for the munchkin mode */
        if (borg.munchkin_mode && borg_los(y9, x9, y, x)
            && (kill->awake && !(rf_has(r_ptr->flags, RF_NEVER_MOVE))))
            return false;

        /* if it walks through walls, not safe */
        if ((rf_has(r_ptr->flags, RF_PASS_WALL)) && !borg_in_vault)
            return false;
        if (rf_has(r_ptr->flags, RF_KILL_WALL) && !borg_in_vault)
            return false;
    }
    return true;
}